

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bfgs.cc
# Opt level: O0

void update_weight(vw *all,float step_size)

{
  long in_RDI;
  dense_parameters *in_stack_00000020;
  float in_stack_0000002c;
  vw *in_stack_00000030;
  float in_stack_0000003c;
  vw *in_stack_00000040;
  
  if ((*(byte *)(in_RDI + 0x3590) & 1) == 0) {
    update_weight<dense_parameters>(in_stack_00000030,in_stack_0000002c,in_stack_00000020);
  }
  else {
    update_weight<sparse_parameters>
              (in_stack_00000040,in_stack_0000003c,(sparse_parameters *)in_stack_00000030);
  }
  return;
}

Assistant:

void update_weight(vw& all, float step_size)
{
  if (all.weights.sparse)
    update_weight(all, step_size, all.weights.sparse_weights);
  else
    update_weight(all, step_size, all.weights.dense_weights);
}